

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_comp.cpp
# Opt level: O3

void __thiscall
crnlib::crn_comp::optimize_color_endpoints_task(crn_comp *this,uint64 data,void *pData_ptr)

{
  uint8 *puVar1;
  int *piVar2;
  float fVar3;
  uint8 uVar4;
  ushort uVar5;
  ushort uVar6;
  vector<unsigned_short> *remapping;
  long lVar7;
  level_details *plVar8;
  endpoint_indices_details *peVar9;
  unsigned_short *puVar10;
  undefined8 uVar11;
  unsigned_short uVar12;
  long lVar13;
  uint16 i;
  ulong uVar14;
  byte *pbVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  uint uVar19;
  uint uVar20;
  bool bVar21;
  uint uVar22;
  byte bVar23;
  byte bVar24;
  vector<unsigned_char> *packed_data;
  ulong uVar25;
  byte bVar26;
  byte bVar27;
  uint uVar28;
  ulong uVar29;
  uint uVar30;
  uint8 uVar31;
  uint16 i_1;
  int iVar32;
  int iVar33;
  int iVar34;
  ulong uVar35;
  bool bVar36;
  vector<unsigned_int> hist;
  static_huffman_data_model dm;
  symbol_codec codec;
  ushort local_1a6;
  byte local_1a4;
  byte local_1a3;
  byte local_1a2;
  byte local_1a1;
  byte local_1a0;
  byte local_19f;
  byte local_19e;
  byte local_19d;
  byte local_19c;
  byte local_19b;
  uint local_198;
  ulong local_170;
  elemental_vector local_138;
  long local_128;
  uint8 *local_120;
  void *local_118;
  unsigned_short *puStack_110;
  uchar *local_100;
  uint local_f8;
  unsigned_short *local_e0;
  ulong local_d8;
  ulong local_d0;
  symbol_codec local_c8;
  
  remapping = *(vector<unsigned_short> **)((long)pData_ptr + 0x18);
  uVar5 = *(ushort *)((long)pData_ptr + 0x10);
  uVar35 = (ulong)uVar5;
  uVar20 = remapping->m_size;
  uVar30 = (uint)uVar5;
  uVar16 = (uint)uVar5;
  if (uVar20 != uVar5) {
    if (uVar20 <= uVar5) {
      if (remapping->m_capacity < uVar16) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)remapping,uVar30,uVar20 + 1 == uVar16,2,(object_mover)0x0,
                   false);
        uVar20 = remapping->m_size;
      }
      memset(remapping->m_p + uVar20,0,(ulong)(uVar30 - uVar20) * 2);
    }
    remapping->m_size = uVar30;
  }
  uVar20 = (uint)uVar5;
  if (data == 0) {
    lVar7 = *pData_ptr;
    local_c8.m_pDecode_buf = (uint8 *)0x0;
    local_c8.m_pDecode_buf_next = (uint8 *)0x0;
    if (uVar30 != 0) {
      elemental_vector::increase_capacity
                ((elemental_vector *)&local_c8,uVar20,uVar16 == 1,8,
                 vector<crnlib::optimize_color_params::unpacked_endpoint>::object_mover,false);
      local_c8.m_pDecode_buf_next = (uint8 *)CONCAT44(local_c8.m_pDecode_buf_next._4_4_,uVar20);
      local_118 = (void *)0x0;
      puStack_110 = (unsigned_short *)0x0;
      elemental_vector::increase_capacity
                ((elemental_vector *)&local_118,uVar20,uVar16 == 1,2,(object_mover)0x0,false);
      uVar17 = 0;
      memset((void *)(((ulong)puStack_110 & 0xffffffff) * 2 + (long)local_118),0,
             (ulong)(uVar20 - (uint)puStack_110) * 2);
      puStack_110 = (unsigned_short *)CONCAT44(puStack_110._4_4_,uVar30);
      do {
        local_c8.m_pDecode_buf[uVar17 * 8] = *(uint8 *)(lVar7 + uVar17 * 8);
        local_c8.m_pDecode_buf[uVar17 * 8 + 1] = *(uint8 *)(lVar7 + 1 + uVar17 * 8);
        local_c8.m_pDecode_buf[uVar17 * 8 + 2] = *(uint8 *)(lVar7 + 2 + uVar17 * 8);
        local_c8.m_pDecode_buf[uVar17 * 8 + 3] = *(uint8 *)(lVar7 + 3 + uVar17 * 8);
        local_c8.m_pDecode_buf[uVar17 * 8 + 4] = *(uint8 *)(lVar7 + 4 + uVar17 * 8);
        local_c8.m_pDecode_buf[uVar17 * 8 + 5] = *(uint8 *)(lVar7 + 5 + uVar17 * 8);
        local_c8.m_pDecode_buf[uVar17 * 8 + 6] = *(uint8 *)(lVar7 + 6 + uVar17 * 8);
        local_c8.m_pDecode_buf[uVar17 * 8 + 7] = *(uint8 *)(lVar7 + 7 + uVar17 * 8);
        *(short *)((long)local_118 + uVar17 * 2) = (short)uVar17;
        uVar17 = uVar17 + 1;
      } while (uVar35 != uVar17);
      bVar23 = 0;
      bVar24 = 0;
      uVar20 = 0;
      uVar16 = 0;
      bVar26 = 0;
      bVar27 = 0;
      uVar17 = uVar35;
      do {
        uVar19 = 0xffffffff;
        uVar14 = 0;
        uVar30 = 0;
        do {
          uVar28 = ((uint)local_c8.m_pDecode_buf[uVar14 * 8 + 6] - (uint)bVar27) *
                   ((uint)local_c8.m_pDecode_buf[uVar14 * 8 + 6] - (uint)bVar27) +
                   ((uint)local_c8.m_pDecode_buf[uVar14 * 8 + 5] - (uint)bVar26) *
                   ((uint)local_c8.m_pDecode_buf[uVar14 * 8 + 5] - (uint)bVar26) +
                   (local_c8.m_pDecode_buf[uVar14 * 8 + 4] - uVar16) *
                   (local_c8.m_pDecode_buf[uVar14 * 8 + 4] - uVar16) +
                   (local_c8.m_pDecode_buf[uVar14 * 8 + 2] - uVar20) *
                   (local_c8.m_pDecode_buf[uVar14 * 8 + 2] - uVar20) +
                   ((uint)local_c8.m_pDecode_buf[uVar14 * 8 + 1] - (uint)bVar24) *
                   ((uint)local_c8.m_pDecode_buf[uVar14 * 8 + 1] - (uint)bVar24) +
                   ((uint)local_c8.m_pDecode_buf[uVar14 * 8] - (uint)bVar23) *
                   ((uint)local_c8.m_pDecode_buf[uVar14 * 8] - (uint)bVar23);
          if (uVar28 < uVar19) {
            uVar19 = uVar28;
            uVar30 = (uint)uVar14;
          }
          uVar14 = uVar14 + 1;
        } while (uVar14 < uVar17);
        uVar14 = (ulong)(uVar30 & 0xffff);
        bVar23 = local_c8.m_pDecode_buf[uVar14 * 8];
        bVar24 = local_c8.m_pDecode_buf[uVar14 * 8 + 1];
        uVar20 = (uint)local_c8.m_pDecode_buf[uVar14 * 8 + 2];
        uVar16 = (uint)local_c8.m_pDecode_buf[uVar14 * 8 + 4];
        bVar26 = local_c8.m_pDecode_buf[uVar14 * 8 + 5];
        bVar27 = local_c8.m_pDecode_buf[uVar14 * 8 + 6];
        uVar29 = (ulong)((uVar30 & 0xffff) * 2);
        remapping->m_p[*(ushort *)((long)local_118 + uVar29)] = uVar5 - (short)uVar17;
        *(undefined8 *)(local_c8.m_pDecode_buf + uVar14 * 8) =
             *(undefined8 *)(local_c8.m_pDecode_buf + uVar17 * 8 + -8);
        *(undefined2 *)((long)local_118 + uVar29) =
             *(undefined2 *)((long)local_118 + uVar17 * 2 + -2);
        uVar17 = uVar17 - 1;
      } while (uVar17 != 0);
      crnlib_free(local_118);
      if (local_c8.m_pDecode_buf != (uint8 *)0x0) {
        crnlib_free(local_c8.m_pDecode_buf);
      }
    }
    optimize_color_selectors(this);
    goto LAB_0016834e;
  }
  local_e0 = remapping->m_p;
  lVar7 = *pData_ptr;
  local_128 = *(long *)((long)pData_ptr + 8);
  local_1a6 = *(ushort *)((long)pData_ptr + 0x12);
  uVar17 = (ulong)local_1a6;
  fVar3 = *(float *)((long)pData_ptr + 0x14);
  local_c8.m_pDecode_buf = (uint8 *)0x0;
  local_c8.m_pDecode_buf_next = (uint8 *)0x0;
  elemental_vector::increase_capacity
            ((elemental_vector *)&local_c8,uVar20,uVar30 == 1,0x18,vector<Node>::object_mover,false)
  ;
  if (uVar20 != (uint)local_c8.m_pDecode_buf_next) {
    memset(local_c8.m_pDecode_buf + ((ulong)local_c8.m_pDecode_buf_next & 0xffffffff) * 0x18,0,
           (((ulong)(uVar16 - (uint)local_c8.m_pDecode_buf_next) * 0x18 - 0x18) / 0x18) * 0x18 +
           0x18);
  }
  local_c8.m_pDecode_buf_next = (uint8 *)CONCAT44(local_c8.m_pDecode_buf_next._4_4_,uVar16);
  lVar13 = 0x17;
  uVar14 = 0;
  do {
    *(int *)(local_c8.m_pDecode_buf + lVar13 + -0x17) = (int)uVar14;
    local_c8.m_pDecode_buf[lVar13 + -7] = *(uint8 *)(lVar7 + uVar14 * 8);
    local_c8.m_pDecode_buf[lVar13 + -6] = *(uint8 *)(lVar7 + 1 + uVar14 * 8);
    local_c8.m_pDecode_buf[lVar13 + -5] = *(uint8 *)(lVar7 + 2 + uVar14 * 8);
    local_c8.m_pDecode_buf[lVar13 + -4] = *(uint8 *)(lVar7 + 3 + uVar14 * 8);
    local_c8.m_pDecode_buf[lVar13 + -3] = *(uint8 *)(lVar7 + 4 + uVar14 * 8);
    local_c8.m_pDecode_buf[lVar13 + -2] = *(uint8 *)(lVar7 + 5 + uVar14 * 8);
    local_c8.m_pDecode_buf[lVar13 + -1] = *(uint8 *)(lVar7 + 6 + uVar14 * 8);
    local_c8.m_pDecode_buf[lVar13] = *(uint8 *)(lVar7 + 7 + uVar14 * 8);
    uVar14 = uVar14 + 1;
    lVar13 = lVar13 + 0x18;
  } while (uVar35 != uVar14);
  uVar22 = (uint)uVar5 + (uint)uVar5;
  local_118 = (void *)0x0;
  puStack_110 = (unsigned_short *)0x0;
  elemental_vector::increase_capacity
            ((elemental_vector *)&local_118,uVar22,false,2,(object_mover)0x0,false);
  iVar34 = 0;
  memset((void *)(((ulong)puStack_110 & 0xffffffff) * 2 + (long)local_118),0,
         (ulong)(uVar22 - (uint)puStack_110) * 2);
  puStack_110 = (unsigned_short *)CONCAT44(puStack_110._4_4_,uVar22);
  *(ushort *)((long)local_118 + uVar35 * 2) = local_1a6;
  bVar23 = local_c8.m_pDecode_buf[uVar17 * 0x18 + 0x10];
  local_1a0 = local_c8.m_pDecode_buf[uVar17 * 0x18 + 0x11];
  local_19b = local_c8.m_pDecode_buf[uVar17 * 0x18 + 0x12];
  local_19c = local_c8.m_pDecode_buf[uVar17 * 0x18 + 0x14];
  local_1a3 = local_c8.m_pDecode_buf[uVar17 * 0x18 + 0x15];
  local_19e = local_c8.m_pDecode_buf[uVar17 * 0x18 + 0x16];
  local_170 = (ulong)(uVar5 - 1);
  uVar11 = *(undefined8 *)(local_c8.m_pDecode_buf + local_170 * 0x18 + 8);
  *(undefined8 *)(local_c8.m_pDecode_buf + uVar17 * 0x18) =
       *(undefined8 *)(local_c8.m_pDecode_buf + local_170 * 0x18);
  *(undefined8 *)(local_c8.m_pDecode_buf + uVar17 * 0x18 + 8) = uVar11;
  *(undefined8 *)(local_c8.m_pDecode_buf + uVar17 * 0x18 + 0x10) =
       *(undefined8 *)(local_c8.m_pDecode_buf + local_170 * 0x18 + 0x10);
  if (uVar5 - 1 == 0) {
    uVar17 = 1;
    uVar14 = 1;
  }
  else {
    uVar29 = (ulong)((uint)local_1a6 * (uint)uVar5);
    bVar36 = true;
    bVar21 = true;
    uVar17 = uVar35;
    uVar14 = (ulong)uVar5;
    local_1a4 = local_19e;
    local_1a2 = local_19c;
    local_1a1 = local_19b;
    local_19f = bVar23;
    bVar24 = local_1a0;
    local_19d = local_1a3;
    do {
      local_d8 = uVar14;
      local_d0 = uVar17;
      local_120 = local_c8.m_pDecode_buf;
      pbVar15 = local_c8.m_pDecode_buf + 0x16;
      uVar17 = 0;
      uVar14 = 0;
      uVar20 = 0;
      do {
        uVar16 = *(uint *)(pbVar15 + -0x16);
        iVar32 = *(int *)(pbVar15 + -0x12) + *(int *)(local_128 + uVar29 * 4 + (ulong)uVar16 * 4);
        *(int *)(pbVar15 + -0x12) = iVar32;
        iVar33 = (int)(long)((fVar3 + 1.0) * 4000.0);
        if (bVar21) {
          uVar30 = ((uint)*pbVar15 - (uint)local_1a4) * ((uint)*pbVar15 - (uint)local_1a4) +
                   ((uint)pbVar15[-1] - (uint)local_1a3) * ((uint)pbVar15[-1] - (uint)local_1a3) +
                   ((uint)pbVar15[-2] - (uint)local_1a2) * ((uint)pbVar15[-2] - (uint)local_1a2) +
                   ((uint)pbVar15[-4] - (uint)local_1a1) * ((uint)pbVar15[-4] - (uint)local_1a1) +
                   ((uint)pbVar15[-5] - (uint)local_1a0) * ((uint)pbVar15[-5] - (uint)local_1a0) +
                   ((uint)pbVar15[-6] - (uint)local_19f) * ((uint)pbVar15[-6] - (uint)local_19f);
          if (3999 < uVar30) {
            uVar30 = 4000;
          }
          *(uint *)(pbVar15 + -0xe) = iVar33 - uVar30;
        }
        if (bVar36) {
          uVar30 = ((uint)*pbVar15 - (uint)local_19e) * ((uint)*pbVar15 - (uint)local_19e) +
                   ((uint)pbVar15[-1] - (uint)local_19d) * ((uint)pbVar15[-1] - (uint)local_19d) +
                   ((uint)pbVar15[-2] - (uint)local_19c) * ((uint)pbVar15[-2] - (uint)local_19c) +
                   ((uint)pbVar15[-4] - (uint)local_19b) * ((uint)pbVar15[-4] - (uint)local_19b) +
                   ((uint)pbVar15[-5] - (uint)bVar24) * ((uint)pbVar15[-5] - (uint)bVar24) +
                   ((uint)pbVar15[-6] - (uint)bVar23) * ((uint)pbVar15[-6] - (uint)bVar23);
          if (3999 < uVar30) {
            uVar30 = 4000;
          }
          uVar30 = iVar33 - uVar30;
          *(uint *)(pbVar15 + -10) = uVar30;
        }
        else {
          uVar30 = *(uint *)(pbVar15 + -10);
        }
        if (uVar30 < *(uint *)(pbVar15 + -0xe)) {
          uVar30 = *(uint *)(pbVar15 + -0xe);
        }
        uVar30 = (iVar32 + iVar34) * uVar30 + 1;
        if ((uVar20 < uVar30) || ((uVar20 == uVar30 && (uVar16 < local_1a6)))) {
          uVar14 = uVar17 & 0xffffffff;
          local_1a6 = (ushort)uVar16;
          uVar20 = uVar30;
        }
        uVar17 = uVar17 + 1;
        pbVar15 = pbVar15 + 0x18;
      } while (local_170 != uVar17);
      local_198 = (uint)uVar5;
      uVar29 = (ulong)(local_1a6 * local_198);
      iVar32 = (int)local_d8;
      iVar33 = (int)local_d0;
      if (iVar32 - iVar33 == 0 || iVar32 < iVar33) {
        uVar18 = 0;
        uVar25 = 0;
      }
      else {
        lVar7 = local_128 + uVar29 * 4;
        uVar16 = 0;
        uVar18 = 0;
        uVar17 = local_d8;
        uVar25 = local_d0;
        uVar20 = iVar32 - iVar33;
        do {
          uVar18 = (ulong)((int)uVar18 +
                          *(int *)(lVar7 + (ulong)*(ushort *)((long)local_118 + uVar25 * 2) * 4) *
                          uVar20);
          uVar16 = uVar16 + *(int *)(lVar7 + (ulong)*(ushort *)((long)local_118 + uVar17 * 2) * 4) *
                            uVar20;
          uVar25 = (ulong)((int)uVar25 + 1);
          uVar17 = (ulong)((int)uVar17 - 1);
          bVar36 = 2 < uVar20;
          uVar20 = uVar20 - 2;
        } while (bVar36);
        uVar25 = (ulong)uVar16;
      }
      puVar1 = local_c8.m_pDecode_buf + uVar14 * 0x18;
      iVar34 = *(int *)(puVar1 + 4);
      uVar18 = *(uint *)(puVar1 + 8) * uVar18;
      uVar25 = *(uint *)(puVar1 + 0xc) * uVar25;
      bVar36 = uVar18 - uVar25 == 0;
      bVar21 = uVar18 >= uVar25 && !bVar36;
      if (uVar18 < uVar25 || bVar36) {
        uVar14 = (ulong)(iVar32 + 1);
        *(ushort *)((long)local_118 + uVar14 * 2) = local_1a6;
        bVar23 = puVar1[0x10];
        bVar24 = puVar1[0x11];
        local_19b = puVar1[0x12];
        local_19c = puVar1[0x14];
        local_19d = puVar1[0x15];
        local_19e = puVar1[0x16];
        uVar17 = local_d0;
      }
      else {
        *(ushort *)((long)local_118 + (ulong)(iVar33 - 1) * 2) = local_1a6;
        local_19f = puVar1[0x10];
        local_1a0 = puVar1[0x11];
        local_1a1 = puVar1[0x12];
        local_1a2 = puVar1[0x14];
        local_1a3 = puVar1[0x15];
        local_1a4 = puVar1[0x16];
        uVar17 = (ulong)(iVar33 - 1);
        uVar14 = local_d8;
      }
      iVar34 = iVar34 << 3;
      bVar36 = uVar18 < uVar25 || uVar18 - uVar25 == 0;
      local_170 = local_170 - 1;
      uVar11 = *(undefined8 *)(local_c8.m_pDecode_buf + local_170 * 0x18 + 8);
      *(undefined8 *)puVar1 = *(undefined8 *)(local_c8.m_pDecode_buf + local_170 * 0x18);
      *(undefined8 *)(puVar1 + 8) = uVar11;
      *(undefined8 *)(puVar1 + 0x10) =
           *(undefined8 *)(local_c8.m_pDecode_buf + local_170 * 0x18 + 0x10);
    } while (local_170 != 0);
  }
  if ((uint)uVar14 < ((uint)uVar17 & 0xffff)) {
    if (local_118 != (void *)0x0) goto LAB_00168337;
  }
  else {
    uVar12 = 0;
    do {
      local_e0[*(ushort *)((long)local_118 + (uVar17 & 0xffff) * 2)] = uVar12;
      uVar20 = (int)uVar17 + 1;
      uVar17 = (ulong)uVar20;
      uVar12 = uVar12 + 1;
    } while ((uVar20 & 0xffff) <= (uint)uVar14);
LAB_00168337:
    crnlib_free(local_118);
  }
  if (local_c8.m_pDecode_buf != (uint8 *)0x0) {
    crnlib_free(local_c8.m_pDecode_buf);
  }
LAB_0016834e:
  packed_data = (vector<unsigned_char> *)(*(long *)((long)pData_ptr + 0x18) + 0x10);
  if (this->m_has_etc_color_blocks == true) {
    pack_color_endpoints_etc(this,packed_data,remapping);
  }
  else {
    pack_color_endpoints(this,packed_data,remapping);
  }
  iVar34 = *(int *)(*(long *)((long)pData_ptr + 0x18) + 0x18);
  local_138.m_p = (void *)0x0;
  local_138.m_size = 0;
  local_138.m_capacity = 0;
  if (uVar35 != 0) {
    uVar20 = (uint)uVar5;
    elemental_vector::increase_capacity(&local_138,uVar20,uVar20 == 1,4,(object_mover)0x0,false);
    memset((void *)((local_138._8_8_ & 0xffffffff) * 4 + (long)local_138.m_p),0,
           (ulong)(uVar20 - local_138.m_size) << 2);
    local_138.m_size = uVar20;
  }
  uVar22 = (this->m_levels).m_size;
  if (uVar22 != 0) {
    plVar8 = (this->m_levels).m_p;
    peVar9 = (this->m_endpoint_indices).m_p;
    bVar36 = this->m_has_subblocks;
    uVar17 = 0;
    do {
      uVar20 = plVar8[uVar17].first_block;
      uVar14 = (ulong)uVar20;
      uVar16 = plVar8[uVar17].num_blocks + uVar20;
      if (uVar20 < uVar16) {
        puVar10 = remapping->m_p;
        uVar20 = 0;
        do {
          uVar6 = puVar10[peVar9[uVar14].field_0.field_0.color];
          uVar4 = peVar9[uVar14].reference;
          uVar31 = uVar4;
          if ((bVar36 & 1U) == 0) {
            uVar31 = uVar4 == '\0';
          }
          if ((uVar14 & 1) == 0) {
            uVar31 = uVar4 == '\0';
          }
          if (uVar31 != '\0') {
            iVar33 = uVar6 - uVar20;
            local_198 = (uint)uVar5;
            piVar2 = (int *)((long)local_138.m_p +
                            (ulong)((iVar33 >> 0x1f & local_198) + iVar33) * 4);
            *piVar2 = *piVar2 + 1;
          }
          uVar14 = uVar14 + 1;
          uVar20 = (uint)uVar6;
        } while (uVar16 != uVar14);
        uVar22 = (this->m_levels).m_size;
      }
      uVar17 = uVar17 + 1;
    } while (uVar17 < uVar22);
  }
  static_huffman_data_model::static_huffman_data_model((static_huffman_data_model *)&local_118);
  static_huffman_data_model::init((static_huffman_data_model *)&local_118,(EVP_PKEY_CTX *)0x1);
  if (local_f8 == 0) {
    local_100 = (uchar *)0x0;
  }
  iVar34 = iVar34 << 3;
  if (uVar5 != 0) {
    uVar17 = 0;
    do {
      iVar34 = iVar34 + (uint)local_100[uVar17] * *(int *)((long)local_138.m_p + uVar17 * 4);
      uVar17 = uVar17 + 1;
    } while (uVar35 != uVar17);
  }
  symbol_codec::symbol_codec(&local_c8);
  symbol_codec::start_encoding(&local_c8,0x10000);
  local_c8.m_simulate_encoding = true;
  symbol_codec::encode_transmit_static_huffman_data_model
            (&local_c8,(static_huffman_data_model *)&local_118,false,
             (static_huffman_data_model *)0x0);
  symbol_codec::stop_encoding(&local_c8,false);
  *(uint *)(*(long *)((long)pData_ptr + 0x18) + 0x20) = iVar34 + local_c8.m_total_bits_written;
  crnlib_free(pData_ptr);
  if (local_c8.m_output_syms.m_p != (output_symbol *)0x0) {
    crnlib_free(local_c8.m_output_syms.m_p);
  }
  if (local_c8.m_arith_output_buf.m_p != (uchar *)0x0) {
    crnlib_free(local_c8.m_arith_output_buf.m_p);
  }
  if (local_c8.m_output_buf.m_p != (uchar *)0x0) {
    crnlib_free(local_c8.m_output_buf.m_p);
  }
  static_huffman_data_model::~static_huffman_data_model((static_huffman_data_model *)&local_118);
  if (local_138.m_p != (void *)0x0) {
    crnlib_free(local_138.m_p);
  }
  return;
}

Assistant:

void crn_comp::optimize_color_endpoints_task(uint64 data, void* pData_ptr)
    {
        optimize_color_params* pParams = reinterpret_cast<optimize_color_params*>(pData_ptr);
        crnlib::vector<uint16>& remapping = pParams->pResult->endpoint_remapping;
        uint16 n = pParams->n;
        remapping.resize(n);

        if (data)
        {
            remap_color_endpoints(remapping.get_ptr(), pParams->unpacked_endpoints, pParams->hist, n, pParams->selected, pParams->weight);
        }
        else
        {
            sort_color_endpoints(remapping, pParams->unpacked_endpoints, n);
            optimize_color_selectors();
        }

        m_has_etc_color_blocks ? pack_color_endpoints_etc(pParams->pResult->packed_endpoints, remapping) : pack_color_endpoints(pParams->pResult->packed_endpoints, remapping);
        uint total_bits = pParams->pResult->packed_endpoints.size() << 3;

        crnlib::vector<uint> hist(n);
        for (uint level = 0; level < m_levels.size(); level++)
        {
            for (uint endpoint_index = 0, b = m_levels[level].first_block, bEnd = b + m_levels[level].num_blocks; b < bEnd; b++)
            {
                uint index = remapping[m_endpoint_indices[b].component[cColor]];
                if (m_has_subblocks && b & 1 ? m_endpoint_indices[b].reference : !m_endpoint_indices[b].reference)
                {
                    int sym = index - endpoint_index;
                    hist[sym < 0 ? sym + n : sym]++;
                }
                endpoint_index = index;
            }
        }

        static_huffman_data_model dm;
        dm.init(true, n, hist.get_ptr(), 16);
        const uint8* code_sizes = dm.get_code_sizes();
        for (uint16 s = 0; s < n; s++)
        {
            total_bits += hist[s] * code_sizes[s];
        }

        symbol_codec codec;
        codec.start_encoding(64 * 1024);
        codec.encode_enable_simulation(true);
        codec.encode_transmit_static_huffman_data_model(dm, false);
        codec.stop_encoding(false);
        total_bits += codec.encode_get_total_bits_written();

        pParams->pResult->total_bits = total_bits;

        crnlib_delete(pParams);
    }